

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

int Abc_SclTimeIncUpdate(SC_Man *p)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int RetValue;
  int i;
  Abc_Obj_t *pObj;
  SC_Man *p_local;
  
  iVar1 = Vec_IntSize(p->vChanged);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; iVar1 = Vec_IntSize(p->vChanged), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pNtk = p->pNtk;
      iVar1 = Vec_IntEntry(p->vChanged,local_24);
      pObj_00 = Abc_NtkObj(pNtk,iVar1);
      if ((pObj_00 != (Abc_Obj_t *)0x0) &&
         (Abc_SclTimeIncAddFanins(p,pObj_00), (*(uint *)&pObj_00->field_0x14 >> 6 & 1) == 0)) {
        Abc_SclTimeIncAddNode(p,pObj_00);
      }
    }
    Vec_IntClear(p->vChanged);
    Abc_SclTimeIncUpdateArrival(p);
    Abc_SclTimeIncUpdateDeparture(p);
    Abc_SclTimeIncUpdateClean(p);
    p_local._4_4_ = p->nIncUpdates;
    p->nIncUpdates = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_SclTimeIncUpdate( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i, RetValue;
    if ( Vec_IntSize(p->vChanged) == 0 )
        return 0;
//    Abc_SclTimeIncCheckLevel( p->pNtk );
    Abc_NtkForEachObjVec( p->vChanged, p->pNtk, pObj, i )
    {
        Abc_SclTimeIncAddFanins( p, pObj );
        if ( pObj->fMarkC )
            continue;
        Abc_SclTimeIncAddNode( p, pObj );
    }
    Vec_IntClear( p->vChanged );
    Abc_SclTimeIncUpdateArrival( p );
    Abc_SclTimeIncUpdateDeparture( p );
    Abc_SclTimeIncUpdateClean( p );
    RetValue = p->nIncUpdates;
    p->nIncUpdates = 0;
    return RetValue;
}